

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

size_t xmlDictGetUsage(xmlDictPtr dict)

{
  xmlDictPtr local_28;
  size_t limit;
  xmlDictStringsPtr_conflict pool;
  xmlDictPtr dict_local;
  
  local_28 = (xmlDictPtr)0x0;
  if (dict == (xmlDictPtr)0x0) {
    dict_local = (xmlDictPtr)0x0;
  }
  else {
    for (limit = (size_t)dict->strings; limit != 0; limit = *(size_t *)limit) {
      local_28 = (xmlDictPtr)((long)&local_28->ref_counter + *(long *)(limit + 0x18));
    }
    dict_local = local_28;
  }
  return (size_t)dict_local;
}

Assistant:

size_t
xmlDictGetUsage(xmlDictPtr dict) {
    xmlDictStringsPtr pool;
    size_t limit = 0;

    if (dict == NULL)
	return(0);
    pool = dict->strings;
    while (pool != NULL) {
        limit += pool->size;
	pool = pool->next;
    }
    return(limit);
}